

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O2

void __thiscall ON_SerialNumberMap::Internal_HashTableBuild(ON_SerialNumberMap *this)

{
  if ((this->m_bHashTableIsValid == '\0') && (this->m_active_id_count != 0)) {
    Internal_HashTableGrow(this);
    Internal_HashTableInitialize(this);
    return;
  }
  return;
}

Assistant:

void ON_SerialNumberMap::Internal_HashTableBuild() const
{
  // This function is called when code requires
  // m_hash_table[] to be valid so an id can be looked up.
  if ( false == m_bHashTableIsValid && m_active_id_count > 0 )
  {
    // The hash table is dirty because elements
    // have moved in memory.  Rebuild it putting
    // the newest elements first.
    Internal_HashTableGrow();
    Internal_HashTableInitialize();
  }
}